

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O0

void fl_measure(char *str,int *w,int *h,int draw_symbols)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  double dVar5;
  int *local_70;
  int *local_68;
  char *sym2;
  int symtotal;
  int symwidth [2];
  int W;
  double width;
  int lines;
  int buflen;
  char *e;
  char *p;
  char *linebuf;
  int *piStack_20;
  int draw_symbols_local;
  int *h_local;
  int *w_local;
  char *str_local;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    *w = 0;
    *h = 0;
  }
  else {
    linebuf._4_4_ = draw_symbols;
    piStack_20 = h;
    h_local = w;
    w_local = (int *)str;
    iVar1 = fl_height();
    *piStack_20 = iVar1;
    p = (char *)0x0;
    stack0xffffffffffffffb0 = 0.0;
    symwidth[0] = 0;
    sym2._4_4_ = 0;
    symtotal = 0;
    if (linebuf._4_4_ != 0) {
      if (((char)*w_local == '@') && (*(char *)((long)w_local + 1) == '@')) {
        local_70 = (int *)((long)w_local + 2);
      }
      else {
        local_70 = w_local;
      }
      local_68 = local_70;
      if (((char)*w_local == '@') && (*(char *)((long)w_local + 1) != '@')) {
        while( true ) {
          bVar4 = false;
          if ((char)*w_local != '\0') {
            iVar1 = isspace((int)(char)*w_local);
            bVar4 = iVar1 == 0;
          }
          if (!bVar4) break;
          w_local = (int *)((long)w_local + 1);
        }
        iVar1 = isspace((int)(char)*w_local);
        if (iVar1 != 0) {
          w_local = (int *)((long)w_local + 1);
        }
        local_68 = w_local;
        sym2._4_4_ = *piStack_20;
      }
      pcVar3 = strchr((char *)local_68,0x40);
      if ((pcVar3 != (char *)0x0) && (pcVar3[1] != '@')) {
        symtotal = *piStack_20;
      }
    }
    width._0_4_ = 0;
    e = (char *)w_local;
    while (e != (char *)0x0) {
      _lines = expand_text_(e,&p,0,(double)(*h_local - (sym2._4_4_ + symtotal)),
                            (int *)((long)&width + 4),(double *)(symwidth + 1),(uint)(*h_local != 0)
                            ,linebuf._4_4_);
      dVar5 = ceil(stack0xffffffffffffffb0);
      if (symwidth[0] < (int)dVar5) {
        dVar5 = ceil(stack0xffffffffffffffb0);
        symwidth[0] = (int)dVar5;
      }
      width._0_4_ = width._0_4_ + 1;
      if ((*_lines == '\0') || (((*_lines == '@' && (_lines[1] != '@')) && (linebuf._4_4_ != 0))))
      break;
      e = _lines;
    }
    iVar1 = width._0_4_;
    if (((sym2._4_4_ != 0) || (symtotal != 0)) && (width._0_4_ != 0)) {
      if (sym2._4_4_ != 0) {
        iVar2 = fl_height();
        sym2._4_4_ = iVar1 * iVar2;
      }
      iVar1 = width._0_4_;
      if (symtotal != 0) {
        iVar2 = fl_height();
        symtotal = iVar1 * iVar2;
      }
    }
    *h_local = symwidth[0] + sym2._4_4_ + symtotal;
    *piStack_20 = width._0_4_ * *piStack_20;
  }
  return;
}

Assistant:

void fl_measure(const char* str, int& w, int& h, int draw_symbols) {
  if (!str || !*str) {w = 0; h = 0; return;}
  h = fl_height();
  char *linebuf = NULL;
  const char* p;
  const char* e;
  int buflen;
  int lines;
  double width=0;
  int W = 0;
  int symwidth[2], symtotal;

  symwidth[0] = 0;	// size of symbol at beginning of string (if any)
  symwidth[1] = 0;	// size of symbol at end of string (if any)

  if (draw_symbols) {
    // Symbol at beginning of string?
    const char *sym2 = (str[0]=='@' && str[1]=='@') ? str+2 : str;	// sym2 check will skip leading @@
    if (str[0] == '@' && str[1] != '@') {
      while (*str && !isspace(*str)) { ++str; }		// skip over symbol
      if (isspace(*str)) ++str;				// skip over trailing space
      sym2 = str;					// sym2 check will skip leading symbol
      symwidth[0] = h;
    }
    // Symbol at end of string?
    if ((p=strchr(sym2,'@')) != NULL && p[1] != '@') {
      symwidth[1] = h;
    }
  }

  symtotal = symwidth[0] + symwidth[1];

  for (p = str, lines=0; p;) {
//    e = expand(p, linebuf, w - symtotal, buflen, width, w != 0, draw_symbols);
    e = expand_text_(p, linebuf, 0, w - symtotal, buflen, width,
			w != 0, draw_symbols);
    if ((int)ceil(width) > W) W = (int)ceil(width);
    lines++;
    if (!*e || (*e == '@' && e[1] != '@' && draw_symbols)) break;
    p = e;
  }

  if ((symwidth[0] || symwidth[1]) && lines) {
    if (symwidth[0]) symwidth[0] = lines * fl_height();
    if (symwidth[1]) symwidth[1] = lines * fl_height();
  }

  symtotal = symwidth[0] + symwidth[1];

  w = W + symtotal;
  h = lines*h;
}